

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

iterator * __thiscall
google::
dense_hashtable<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>,int,std::hash<int>,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SelectKey,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>
::insert_at<int,std::unique_ptr<int,std::default_delete<int>>>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>,int,std::hash<int>,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SelectKey,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>
          *this,size_type pos,int *args,unique_ptr<int,_std::default_delete<int>_> *args_1)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  length_error *this_00;
  int *piVar4;
  long lVar5;
  
  lVar5 = *(long *)(this + 0x28);
  if ((ulong)(*(long *)(this + 0x30) - lVar5) < 0xfffffffffffffff) {
    if ((lVar5 == 0) || (*(int *)(this + 0x20) != *(int *)(*(long *)(this + 0x48) + pos * 0x10))) {
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
    }
    else {
      *(long *)(this + 0x28) = lVar5 + -1;
    }
    lVar5 = pos * 0x10;
    pvVar1 = *(void **)(*(long *)(this + 0x48) + 8 + lVar5);
    piVar4 = (int *)(*(long *)(this + 0x48) + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    piVar4[2] = 0;
    piVar4[3] = 0;
    *piVar4 = *args;
    *(int **)(piVar4 + 2) =
         (args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    lVar2 = *(long *)(this + 0x38);
    lVar3 = *(long *)(this + 0x48);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(lVar5 + lVar3);
    __return_storage_ptr__->end = (pointer)(lVar2 * 0x10 + lVar3);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

iterator insert_at(size_type pos, Args&&... args) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been del.
      // shrug: shouldn't need to be const.
      const_iterator delpos(this, table + pos, table + num_buckets, false);
      clear_deleted(delpos);
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    } else {
      ++num_elements;  // replacing an empty bucket
    }
    set_value(&table[pos], std::forward<Args>(args)...);
    return iterator(this, table + pos, table + num_buckets, false);
  }